

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O2

void __thiscall FIX::FileLog::FileLog(FileLog *this,string *path,string *backupPath,SessionID *s)

{
  string local_90;
  string local_70 [32];
  string local_50 [32];
  
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__FileLog_001eeda0;
  std::ofstream::ofstream(&this->m_messages);
  std::ofstream::ofstream(&this->m_event);
  (this->m_messagesFileName)._M_dataplus._M_p = (pointer)&(this->m_messagesFileName).field_2;
  (this->m_messagesFileName)._M_string_length = 0;
  (this->m_messagesFileName).field_2._M_local_buf[0] = '\0';
  (this->m_eventFileName)._M_dataplus._M_p = (pointer)&(this->m_eventFileName).field_2;
  (this->m_eventFileName)._M_string_length = 0;
  (this->m_eventFileName).field_2._M_local_buf[0] = '\0';
  (this->m_fullPrefix)._M_dataplus._M_p = (pointer)&(this->m_fullPrefix).field_2;
  (this->m_fullPrefix)._M_string_length = 0;
  (this->m_fullPrefix).field_2._M_local_buf[0] = '\0';
  (this->m_fullBackupPrefix)._M_dataplus._M_p = (pointer)&(this->m_fullBackupPrefix).field_2;
  (this->m_fullBackupPrefix)._M_string_length = 0;
  (this->m_fullBackupPrefix).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string(local_50,(string *)path);
  std::__cxx11::string::string(local_70,(string *)backupPath);
  generatePrefix_abi_cxx11_(&local_90,(FileLog *)backupPath,s);
  init(this,(EVP_PKEY_CTX *)local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

FileLog::FileLog( const std::string& path, const std::string& backupPath, const SessionID& s )
{
  init( path, backupPath, generatePrefix(s) );
}